

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O1

TIFFReadDirEntryErr
TIFFReadDirEntryDataAndRealloc(TIFF *tif,uint64_t offset,tmsize_t size,void **pdest)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  void *pvVar4;
  tmsize_t tVar5;
  TIFFReadDirEntryErr TVar6;
  void **ppvVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  
  if ((tif->tif_flags & 0x800) != 0) {
    __assert_fail("!isMapped(tif)",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirread.c"
                  ,0x4c0,
                  "enum TIFFReadDirEntryErr TIFFReadDirEntryDataAndRealloc(TIFF *, uint64_t, tmsize_t, void **)"
                 );
  }
  ppvVar7 = pdest;
  iVar2 = _TIFFSeekOK(tif,offset);
  if (iVar2 == 0) {
    TVar6 = TIFFReadDirEntryErrIo;
  }
  else {
    lVar3 = 0x100000;
    lVar8 = 0;
    do {
      lVar9 = size - lVar8;
      if (lVar9 == 0 || size < lVar8) {
        return TIFFReadDirEntryErrOk;
      }
      if (lVar3 <= lVar9 && lVar3 < 0x3e800000) {
        lVar9 = lVar3;
        lVar3 = lVar3 * 10;
      }
      pvVar4 = _TIFFreallocExt(tif,*pdest,lVar9 + lVar8);
      if (pvVar4 == (void *)0x0) {
        bVar10 = false;
        TIFFErrorExtR(tif,tif->tif_name,
                      "Failed to allocate memory for %s (%ld elements of %ld bytes each)",
                      "TIFFReadDirEntryArray",1,lVar9 + lVar8);
        ppvVar7 = (void **)&DAT_00000007;
      }
      else {
        *pdest = pvVar4;
        tVar5 = (*tif->tif_readproc)(tif->tif_clientdata,(void *)((long)pvVar4 + lVar8),lVar9);
        lVar8 = lVar8 + tVar5;
        bVar10 = tVar5 == lVar9;
        uVar1 = (uint)ppvVar7;
        if (!bVar10) {
          uVar1 = 3;
        }
        ppvVar7 = (void **)(ulong)uVar1;
      }
      TVar6 = (TIFFReadDirEntryErr)ppvVar7;
    } while (bVar10);
  }
  return TVar6;
}

Assistant:

static enum TIFFReadDirEntryErr TIFFReadDirEntryDataAndRealloc(TIFF *tif,
                                                               uint64_t offset,
                                                               tmsize_t size,
                                                               void **pdest)
{
#if SIZEOF_SIZE_T == 8
    tmsize_t threshold = INITIAL_THRESHOLD;
#endif
    tmsize_t already_read = 0;

    assert(!isMapped(tif));

    if (!SeekOK(tif, offset))
        return (TIFFReadDirEntryErrIo);

    /* On 64 bit processes, read first a maximum of 1 MB, then 10 MB, etc */
    /* so as to avoid allocating too much memory in case the file is too */
    /* short. We could ask for the file size, but this might be */
    /* expensive with some I/O layers (think of reading a gzipped file) */
    /* Restrict to 64 bit processes, so as to avoid reallocs() */
    /* on 32 bit processes where virtual memory is scarce.  */
    while (already_read < size)
    {
        void *new_dest;
        tmsize_t bytes_read;
        tmsize_t to_read = size - already_read;
#if SIZEOF_SIZE_T == 8
        if (to_read >= threshold && threshold < MAX_THRESHOLD)
        {
            to_read = threshold;
            threshold *= THRESHOLD_MULTIPLIER;
        }
#endif

        new_dest =
            (uint8_t *)_TIFFreallocExt(tif, *pdest, already_read + to_read);
        if (new_dest == NULL)
        {
            TIFFErrorExtR(tif, tif->tif_name,
                          "Failed to allocate memory for %s "
                          "(%" TIFF_SSIZE_FORMAT
                          " elements of %" TIFF_SSIZE_FORMAT " bytes each)",
                          "TIFFReadDirEntryArray", (tmsize_t)1,
                          already_read + to_read);
            return TIFFReadDirEntryErrAlloc;
        }
        *pdest = new_dest;

        bytes_read = TIFFReadFile(tif, (char *)*pdest + already_read, to_read);
        already_read += bytes_read;
        if (bytes_read != to_read)
        {
            return TIFFReadDirEntryErrIo;
        }
    }
    return TIFFReadDirEntryErrOk;
}